

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetStringValue(MapValueRef *this,string *value)

{
  CppType CVar1;
  LogMessage *this_00;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  LogMessage *in_stack_ffffffffffffff50;
  LogLevel_conflict in_stack_ffffffffffffff5c;
  LogMessage *in_stack_ffffffffffffff60;
  MapValueRef *in_stack_ffffffffffffffb0;
  
  CVar1 = type(in_stack_ffffffffffffffb0);
  if (CVar1 != CPPTYPE_STRING) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)in_stack_ffffffffffffff50
               ,in_stack_ffffffffffffff4c);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    FieldDescriptor::CppTypeName(CPPTYPE_STRING);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff50,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    CVar1 = type(in_stack_ffffffffffffffb0);
    FieldDescriptor::CppTypeName(CVar1);
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff50,
                         (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    internal::LogMessage::~LogMessage((LogMessage *)0x43df98);
  }
  std::__cxx11::string::operator=((string *)*in_RDI,in_RSI);
  return;
}

Assistant:

void SetStringValue(const std::string& value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_STRING, "MapValueRef::SetStringValue");
    *reinterpret_cast<std::string*>(data_) = value;
  }